

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fglrx.c
# Opt level: O0

void decode_fglrx_ioctl_64(fglrx_ioctl_64 *d,mmt_memory_dump *args,int argc)

{
  int iVar1;
  mmt_buf *local_30;
  mmt_buf *__ret;
  mmt_buf *data1;
  int argc_local;
  mmt_memory_dump *args_local;
  fglrx_ioctl_64 *d_local;
  
  local_30 = (mmt_buf *)0x0;
  if ((d->ptr1 != 0) || (iVar1 = _fglrx_field_enabled("ptr1"), iVar1 != 0)) {
    if (d->ptr1 == 0) {
      fprintf(_stdout,"%sptr1: %s",fglrx_pfx,"NULL");
    }
    else {
      fprintf(_stdout,"%sptr1: 0x%016lx",fglrx_pfx,d->ptr1);
      if (0 < argc) {
        local_30 = find_ptr(d->ptr1,args,argc);
      }
      if (local_30 == (mmt_buf *)0x0) {
        fprintf(_stdout,"%s"," [no data]");
      }
    }
  }
  fglrx_pfx = fglrx_sep;
  if ((d->unk08 != 0) || (iVar1 = _fglrx_field_enabled("unk08"), iVar1 != 0)) {
    fprintf(_stdout,"%sunk08: 0x%08x",fglrx_pfx,(ulong)d->unk08);
  }
  fglrx_pfx = fglrx_sep;
  if ((d->unk0c != 0) || (iVar1 = _fglrx_field_enabled("unk0c"), iVar1 != 0)) {
    fprintf(_stdout,"%sunk0c: 0x%08x",fglrx_pfx,(ulong)d->unk0c);
  }
  fglrx_pfx = fglrx_sep;
  fprintf(_stdout,"\n");
  if (mmt_sync_fd != -1) {
    fflush(_stdout);
  }
  if (local_30 != (mmt_buf *)0x0) {
    dump_mmt_buf_as_words_horiz(local_30,"ptr1[]:");
  }
  return;
}

Assistant:

static void decode_fglrx_ioctl_64(struct fglrx_ioctl_64 *d, struct mmt_memory_dump *args, int argc)
{
	struct mmt_buf *data1 = fglrx_print_ptr(d, ptr1, args, argc);
	fglrx_print_x32(d, unk08);
	fglrx_print_x32(d, unk0c);
	mmt_log_cont_nl();

	if (data1)
		dump_mmt_buf_as_words_horiz(data1, "ptr1[]:");
}